

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::
fastAccessDx(FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
             *this,int i)

{
  Fad<double> *this_00;
  long in_RSI;
  value_type *in_RDI;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Fad<Fad<double>_> *in_stack_ffffffffffffff40;
  Fad<double> *in_stack_ffffffffffffff70;
  Fad<double> *in_stack_ffffffffffffff78;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff88;
  Fad<double> *in_stack_ffffffffffffff90;
  
  FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::fastAccessDx
            ((FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)in_RDI,
             (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  Fad<Fad<double>_>::val(*(Fad<Fad<double>_> **)(in_RSI + 8));
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  this_00 = Fad<Fad<double>_>::fastAccessDx(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::val
            ((FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  operator+<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff78,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff70);
  Fad<double>::
  Fad<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)this_00);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this_00);
  Fad<double>::~Fad(this_00);
  return in_RDI;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}